

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testparse.c
# Opt level: O2

void print_typeinfo(MOJOSHADER_symbolTypeInfo *info,uint indent)

{
  MOJOSHADER_symbolStructMember *pMVar1;
  uint indent_00;
  long lVar2;
  ulong uVar3;
  
  if (indent == 0) {
    printf("      symbol class %s\n",print_typeinfo::symclasses[info->parameter_class]);
  }
  else {
    do_indent(indent);
    printf("      symbol class %s\n",print_typeinfo::symclasses[info->parameter_class]);
    do_indent(indent);
  }
  printf("      symbol type %s\n",
         print_typeinfo_symtypes_rel +
         *(int *)(print_typeinfo_symtypes_rel + (ulong)info->parameter_type * 4));
  if (indent == 0) {
    printf("      rows %u\n",(ulong)info->rows);
  }
  else {
    do_indent(indent);
    printf("      rows %u\n",(ulong)info->rows);
    do_indent(indent);
  }
  printf("      columns %u\n",(ulong)info->columns);
  if (indent != 0) {
    do_indent(indent);
  }
  printf("      elements %u\n",(ulong)info->elements);
  if (info->member_count != 0) {
    if (indent != 0) {
      do_indent(indent);
    }
    puts("      MEMBERS:");
    indent_00 = indent + 1;
    lVar2 = 8;
    for (uVar3 = 0; uVar3 < info->member_count; uVar3 = uVar3 + 1) {
      pMVar1 = info->members;
      if (indent != 0) {
        do_indent(indent);
      }
      puts("      MEMBERS:");
      if (indent_00 != 0) {
        do_indent(indent_00);
      }
      printf("      * %d: \"%s\"\n",uVar3 & 0xffffffff,*(undefined8 *)((long)pMVar1 + lVar2 + -8));
      print_typeinfo((MOJOSHADER_symbolTypeInfo *)((long)&pMVar1->name + lVar2),indent_00);
      lVar2 = lVar2 + 0x28;
    }
  }
  return;
}

Assistant:

static void print_typeinfo(const MOJOSHADER_symbolTypeInfo *info,
                           unsigned int indent)
{
    static const char *symclasses[] = {
        "scalar", "vector", "row-major matrix",
        "column-major matrix", "object", "struct"
    };

    static const char *symtypes[] = {
        "void", "bool", "int", "float", "string", "texture",
        "texture1d", "texture2d", "texture3d", "texturecube",
        "sampler", "sampler1d", "sampler2d", "sampler3d",
        "samplercube", "pixelshader", "vertexshader", "unsupported"
    };

    INDENT();
    printf("      symbol class %s\n", symclasses[info->parameter_class]);
    INDENT();
    printf("      symbol type %s\n", symtypes[info->parameter_type]);
    INDENT();
    printf("      rows %u\n", info->rows);
    INDENT();
    printf("      columns %u\n", info->columns);
    INDENT();
    printf("      elements %u\n", info->elements);

    if (info->member_count > 0)
    {
        int i;
        INDENT(); printf("      MEMBERS:\n");
        for (i = 0; i < info->member_count; i++)
        {
            const MOJOSHADER_symbolStructMember *member = &info->members[i];
            INDENT(); printf("      MEMBERS:\n");
            indent++;
            INDENT(); printf("      * %d: \"%s\"\n", i, member->name);
            print_typeinfo(&member->info, indent);
            indent--;
        } // for
    } // if
}